

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_commitment_parse
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *input)

{
  int iVar1;
  secp256k1_fe x;
  secp256k1_ge ge;
  secp256k1_fe sStack_98;
  secp256k1_ge local_70;
  
  if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_pedersen_commitment_parse_cold_2();
  }
  else {
    if (input != (uchar *)0x0) {
      if ((*input & 0xfe) != 8) {
        return 0;
      }
      iVar1 = secp256k1_fe_set_b32(&sStack_98,input + 1);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_ge_set_xquad(&local_70,&sStack_98);
      if (iVar1 == 0) {
        return 0;
      }
      if ((*input & 1) != 0) {
        secp256k1_ge_neg(&local_70,&local_70);
      }
      secp256k1_pedersen_commitment_save(commit,&local_70);
      return 1;
    }
    secp256k1_pedersen_commitment_parse_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_commitment_parse(const secp256k1_context* ctx, secp256k1_pedersen_commitment* commit, const unsigned char *input) {
    secp256k1_fe x;
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(input != NULL);
    (void) ctx;

    if ((input[0] & 0xFE) != 8 ||
        !secp256k1_fe_set_b32(&x, &input[1]) ||
        !secp256k1_ge_set_xquad(&ge, &x)) {
        return 0;
    }
    if (input[0] & 1) {
        secp256k1_ge_neg(&ge, &ge);
    }
    secp256k1_pedersen_commitment_save(commit, &ge);
    return 1;
}